

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O0

void __thiscall spatial_region::pmerging(spatial_region *this,double *ppd,string *pmerging)

{
  particle *ppVar1;
  particle *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  cellp ***pppcVar10;
  double *pdVar11;
  double *in_RSI;
  spatial_region *in_RDI;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int ii_6;
  int k_6;
  int j_6;
  int i_11;
  int i_10;
  int ii_5;
  int k_5;
  int j_5;
  int i_9;
  int ii_4;
  int k_4;
  int j_4;
  int i_8;
  int i_7;
  int ii_3;
  int k_3;
  int j_3;
  int i_6;
  int i_5;
  double *av_q;
  int ii_2;
  int k_2;
  int j_2;
  int i_4;
  int i_3;
  int ii_1;
  int k_1;
  int j_1;
  int i_2;
  int ii;
  int k;
  int j;
  int i_1;
  int i;
  double *a;
  double *qs;
  particle *tmp;
  particle *current;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  spatial_region *in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffeb0;
  particle *in_stack_fffffffffffffeb8;
  spatial_region *in_stack_fffffffffffffec0;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  particle *local_20;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_RDI->n_ion_populations + 3);
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_RDI->n_ion_populations + 3);
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar9 = (double *)operator_new__(uVar7);
  for (local_3c = 0; local_3c < in_RDI->n_ion_populations + 3; local_3c = local_3c + 1) {
    pdVar8[local_3c] = 0.0;
    pdVar9[local_3c] = 0.0;
  }
  for (local_40 = 0; local_40 < in_RDI->nx; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < in_RDI->ny; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < in_RDI->nz; local_48 = local_48 + 1) {
        pppcVar10 = field3d<cellp>::operator[]
                              ((field3d<cellp> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c
                              );
        for (local_20 = (*pppcVar10)[local_44][local_48].pl.head; local_20 != (particle *)0x0;
            local_20 = local_20->next) {
          if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
            if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
              if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                for (local_4c = 0; local_4c < in_RDI->n_ion_populations; local_4c = local_4c + 1) {
                  if ((local_20->cmr == in_RDI->icmr[local_4c]) &&
                     (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_4c]))) {
                    pdVar9[local_4c + 3] = local_20->q + pdVar9[local_4c + 3];
                  }
                }
              }
              else {
                pdVar9[2] = local_20->q + pdVar9[2];
              }
            }
            else {
              pdVar9[1] = local_20->q + pdVar9[1];
            }
          }
          else {
            *pdVar9 = *pdVar9 - local_20->q;
          }
        }
      }
    }
  }
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe40,
                          (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (bVar6) {
    for (local_50 = 0; local_50 < in_RDI->nx; local_50 = local_50 + 1) {
      for (local_54 = 0; local_54 < in_RDI->ny; local_54 = local_54 + 1) {
        for (local_58 = 0; local_58 < in_RDI->nz; local_58 = local_58 + 1) {
          pppcVar10 = field3d<cellp>::operator[]
                                ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                 in_stack_fffffffffffffe3c);
          local_20 = (*pppcVar10)[local_54][local_58].pl.head;
          while (local_20 != (particle *)0x0) {
            dVar14 = get_rand(in_RDI);
            if (*in_RSI <= dVar14) {
              local_20 = local_20->next;
            }
            else {
              ppVar1 = local_20->next;
              if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                  if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                    for (local_5c = 0; local_5c < in_RDI->n_ion_populations; local_5c = local_5c + 1
                        ) {
                      if ((local_20->cmr == in_RDI->icmr[local_5c]) &&
                         (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_5c]))) {
                        pdVar8[local_5c + 3] = local_20->q + pdVar8[local_5c + 3];
                      }
                    }
                  }
                  else {
                    pdVar8[2] = local_20->q + pdVar8[2];
                  }
                }
                else {
                  pdVar8[1] = local_20->q + pdVar8[1];
                }
              }
              else {
                *pdVar8 = *pdVar8 - local_20->q;
              }
              if (local_20->next != (particle *)0x0) {
                local_20->next->previous = local_20->previous;
              }
              if (local_20->previous == (particle *)0x0) {
                ppVar2 = local_20->next;
                pppcVar10 = field3d<cellp>::operator[]
                                      ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                       in_stack_fffffffffffffe3c);
                (*pppcVar10)[local_54][local_58].pl.head = ppVar2;
                pppcVar10 = field3d<cellp>::operator[]
                                      ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                       in_stack_fffffffffffffe3c);
                ppVar2 = (*pppcVar10)[local_54][local_58].pl.head;
                pppcVar10 = field3d<cellp>::operator[]
                                      ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                       in_stack_fffffffffffffe3c);
                (*pppcVar10)[local_54][local_58].pl.start = ppVar2;
              }
              else {
                local_20->previous->next = local_20->next;
              }
              delete_particle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
              local_20 = ppVar1;
            }
          }
        }
      }
    }
    if ((*pdVar9 - *pdVar8 != 0.0) || (NAN(*pdVar9 - *pdVar8))) {
      *pdVar9 = *pdVar9 / (*pdVar9 - *pdVar8);
    }
    if ((pdVar9[1] - pdVar8[1] != 0.0) || (NAN(pdVar9[1] - pdVar8[1]))) {
      pdVar9[1] = pdVar9[1] / (pdVar9[1] - pdVar8[1]);
    }
    if ((pdVar9[2] - pdVar8[2] != 0.0) || (NAN(pdVar9[2] - pdVar8[2]))) {
      pdVar9[2] = pdVar9[2] / (pdVar9[2] - pdVar8[2]);
    }
    for (local_60 = 0; local_60 < in_RDI->n_ion_populations; local_60 = local_60 + 1) {
      if ((pdVar9[local_60 + 3] - pdVar8[local_60 + 3] != 0.0) ||
         (NAN(pdVar9[local_60 + 3] - pdVar8[local_60 + 3]))) {
        pdVar9[local_60 + 3] = pdVar9[local_60 + 3] / (pdVar9[local_60 + 3] - pdVar8[local_60 + 3]);
      }
    }
    for (local_64 = 0; local_64 < in_RDI->nx; local_64 = local_64 + 1) {
      for (local_68 = 0; local_68 < in_RDI->ny; local_68 = local_68 + 1) {
        for (local_6c = 0; local_6c < in_RDI->nz; local_6c = local_6c + 1) {
          pppcVar10 = field3d<cellp>::operator[]
                                ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                 in_stack_fffffffffffffe3c);
          for (local_20 = (*pppcVar10)[local_68][local_6c].pl.head; local_20 != (particle *)0x0;
              local_20 = local_20->next) {
            if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
              if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                  for (local_70 = 0; local_70 < in_RDI->n_ion_populations; local_70 = local_70 + 1)
                  {
                    if ((local_20->cmr == in_RDI->icmr[local_70]) &&
                       (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_70]))) {
                      local_20->q = pdVar9[local_70 + 3] * local_20->q;
                    }
                  }
                }
                else {
                  local_20->q = pdVar9[2] * local_20->q;
                }
              }
              else {
                local_20->q = pdVar9[1] * local_20->q;
              }
            }
            else {
              local_20->q = *pdVar9 * local_20->q;
            }
          }
        }
      }
    }
  }
  else {
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe40,
                            (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if (bVar6) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)(in_RDI->n_ion_populations + 3);
      uVar7 = SUB168(auVar5 * ZEXT816(8),0);
      if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pdVar11 = (double *)operator_new__(uVar7);
      for (local_7c = 0; local_7c < in_RDI->n_ion_populations + 3; local_7c = local_7c + 1) {
        pdVar11[local_7c] = 0.0;
      }
      for (local_80 = 0; local_80 < in_RDI->nx; local_80 = local_80 + 1) {
        for (local_84 = 0; local_84 < in_RDI->ny; local_84 = local_84 + 1) {
          for (local_88 = 0; local_88 < in_RDI->nz; local_88 = local_88 + 1) {
            pppcVar10 = field3d<cellp>::operator[]
                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
            for (local_20 = (*pppcVar10)[local_84][local_88].pl.head; local_20 != (particle *)0x0;
                local_20 = local_20->next) {
              if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                  if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                    for (local_8c = 0; local_8c < in_RDI->n_ion_populations; local_8c = local_8c + 1
                        ) {
                      if ((local_20->cmr == in_RDI->icmr[local_8c]) &&
                         (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_8c]))) {
                        pdVar11[local_8c + 3] = pdVar11[local_8c + 3] + 1.0;
                      }
                    }
                  }
                  else {
                    pdVar11[2] = pdVar11[2] + 1.0;
                  }
                }
                else {
                  pdVar11[1] = pdVar11[1] + 1.0;
                }
              }
              else {
                *pdVar11 = *pdVar11 + 1.0;
              }
            }
          }
        }
      }
      for (local_90 = 0; local_90 < in_RDI->n_ion_populations + 3; local_90 = local_90 + 1) {
        pdVar11[local_90] = pdVar9[local_90] / pdVar11[local_90];
      }
      for (local_94 = 0; local_94 < in_RDI->nx; local_94 = local_94 + 1) {
        for (local_98 = 0; local_98 < in_RDI->ny; local_98 = local_98 + 1) {
          for (local_9c = 0; local_9c < in_RDI->nz; local_9c = local_9c + 1) {
            pppcVar10 = field3d<cellp>::operator[]
                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
            ppVar1 = (*pppcVar10)[local_98][local_9c].pl.head;
            while (local_20 = ppVar1, local_20 != (particle *)0x0) {
              ppVar1 = local_20->next;
              if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                  if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                    for (local_a0 = 0; local_a0 < in_RDI->n_ion_populations; local_a0 = local_a0 + 1
                        ) {
                      if ((local_20->cmr == in_RDI->icmr[local_a0]) &&
                         (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_a0]))) {
                        dVar14 = get_rand(in_RDI);
                        in_stack_fffffffffffffeb0 = in_RSI[local_a0 + 3];
                        dVar12 = _ppd(in_stack_fffffffffffffe40,
                                      (double)CONCAT44(in_stack_fffffffffffffe3c,
                                                       in_stack_fffffffffffffe38),
                                      7.67194028043913e-318);
                        if (dVar14 < in_stack_fffffffffffffeb0 * dVar12) {
                          if (local_20->next != (particle *)0x0) {
                            local_20->next->previous = local_20->previous;
                          }
                          if (local_20->previous == (particle *)0x0) {
                            ppVar2 = local_20->next;
                            pppcVar10 = field3d<cellp>::operator[]
                                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                                   in_stack_fffffffffffffe3c);
                            (*pppcVar10)[local_98][local_9c].pl.head = ppVar2;
                            ppVar2 = local_20->next;
                            pppcVar10 = field3d<cellp>::operator[]
                                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                                   in_stack_fffffffffffffe3c);
                            (*pppcVar10)[local_98][local_9c].pl.start = ppVar2;
                          }
                          else {
                            local_20->previous->next = local_20->next;
                          }
                          delete_particle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                          SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
                        }
                      }
                    }
                  }
                  else {
                    dVar12 = get_rand(in_RDI);
                    dVar14 = in_RSI[2];
                    dVar13 = _ppd(in_stack_fffffffffffffe40,
                                  (double)CONCAT44(in_stack_fffffffffffffe3c,
                                                   in_stack_fffffffffffffe38),7.66937113908075e-318)
                    ;
                    if (dVar12 < dVar14 * dVar13) {
                      if (local_20->next != (particle *)0x0) {
                        local_20->next->previous = local_20->previous;
                      }
                      if (local_20->previous == (particle *)0x0) {
                        in_stack_fffffffffffffeb8 = local_20->next;
                        pppcVar10 = field3d<cellp>::operator[]
                                              ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                               in_stack_fffffffffffffe3c);
                        (*pppcVar10)[local_98][local_9c].pl.head = in_stack_fffffffffffffeb8;
                        in_stack_fffffffffffffec0 = (spatial_region *)local_20->next;
                        pppcVar10 = field3d<cellp>::operator[]
                                              ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                               in_stack_fffffffffffffe3c);
                        (*pppcVar10)[local_98][local_9c].pl.start =
                             (particle *)in_stack_fffffffffffffec0;
                      }
                      else {
                        local_20->previous->next = local_20->next;
                      }
                      delete_particle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                      SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
                    }
                  }
                }
                else {
                  dVar12 = get_rand(in_RDI);
                  dVar14 = in_RSI[1];
                  dVar13 = _ppd(in_stack_fffffffffffffe40,
                                (double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ),7.66715772498738e-318);
                  if (dVar12 < dVar14 * dVar13) {
                    if (local_20->next != (particle *)0x0) {
                      local_20->next->previous = local_20->previous;
                    }
                    if (local_20->previous == (particle *)0x0) {
                      ppVar2 = local_20->next;
                      pppcVar10 = field3d<cellp>::operator[]
                                            ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                             in_stack_fffffffffffffe3c);
                      (*pppcVar10)[local_98][local_9c].pl.head = ppVar2;
                      ppVar2 = local_20->next;
                      pppcVar10 = field3d<cellp>::operator[]
                                            ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                             in_stack_fffffffffffffe3c);
                      (*pppcVar10)[local_98][local_9c].pl.start = ppVar2;
                    }
                    else {
                      local_20->previous->next = local_20->next;
                    }
                    delete_particle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                    SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
                  }
                }
              }
              else {
                dVar12 = get_rand(in_RDI);
                dVar14 = *in_RSI;
                dVar13 = _ppd(in_stack_fffffffffffffe40,
                              (double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              7.66492454826818e-318);
                if (dVar12 < dVar14 * dVar13) {
                  if (local_20->next != (particle *)0x0) {
                    local_20->next->previous = local_20->previous;
                  }
                  if (local_20->previous == (particle *)0x0) {
                    ppVar2 = local_20->next;
                    pppcVar10 = field3d<cellp>::operator[]
                                          ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                           in_stack_fffffffffffffe3c);
                    (*pppcVar10)[local_98][local_9c].pl.head = ppVar2;
                    ppVar2 = local_20->next;
                    pppcVar10 = field3d<cellp>::operator[]
                                          ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                           in_stack_fffffffffffffe3c);
                    (*pppcVar10)[local_98][local_9c].pl.start = ppVar2;
                  }
                  else {
                    local_20->previous->next = local_20->next;
                  }
                  delete_particle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                  SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
                }
              }
            }
          }
        }
      }
      for (local_a4 = 0; local_a4 < in_RDI->nx; local_a4 = local_a4 + 1) {
        for (local_a8 = 0; local_a8 < in_RDI->ny; local_a8 = local_a8 + 1) {
          for (local_ac = 0; local_ac < in_RDI->nz; local_ac = local_ac + 1) {
            pppcVar10 = field3d<cellp>::operator[]
                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
            for (local_20 = (*pppcVar10)[local_a8][local_ac].pl.head; local_20 != (particle *)0x0;
                local_20 = local_20->next) {
              if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                  if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                    for (local_b0 = 0; local_b0 < in_RDI->n_ion_populations; local_b0 = local_b0 + 1
                        ) {
                      if ((local_20->cmr == in_RDI->icmr[local_b0]) &&
                         (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_b0]))) {
                        dVar14 = local_20->q;
                        dVar12 = in_RSI[local_b0 + 3];
                        auVar18._0_8_ =
                             _ppd(in_stack_fffffffffffffe40,
                                  (double)CONCAT44(in_stack_fffffffffffffe3c,
                                                   in_stack_fffffffffffffe38),7.67927715527987e-318)
                        ;
                        auVar18._8_56_ = extraout_var_02;
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = -dVar12;
                        auVar3 = vfmadd213sd_fma(auVar18._0_16_,auVar22,ZEXT816(0x3ff0000000000000))
                        ;
                        local_20->q = dVar14 / auVar3._0_8_;
                        pdVar8[local_b0 + 3] = local_20->q + pdVar8[local_b0 + 3];
                      }
                    }
                  }
                  else {
                    dVar14 = local_20->q;
                    dVar12 = in_RSI[2];
                    auVar17._0_8_ =
                         _ppd(in_stack_fffffffffffffe40,
                              (double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              7.67782954293756e-318);
                    auVar17._8_56_ = extraout_var_01;
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = -dVar12;
                    auVar3 = vfmadd213sd_fma(auVar17._0_16_,auVar21,ZEXT816(0x3ff0000000000000));
                    local_20->q = dVar14 / auVar3._0_8_;
                    pdVar8[2] = local_20->q + pdVar8[2];
                  }
                }
                else {
                  dVar14 = local_20->q;
                  dVar12 = in_RSI[1];
                  auVar16._0_8_ =
                       _ppd(in_stack_fffffffffffffe40,
                            (double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            7.676767301799e-318);
                  auVar16._8_56_ = extraout_var_00;
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = -dVar12;
                  auVar3 = vfmadd213sd_fma(auVar16._0_16_,auVar20,ZEXT816(0x3ff0000000000000));
                  local_20->q = dVar14 / auVar3._0_8_;
                  pdVar8[1] = local_20->q + pdVar8[1];
                }
              }
              else {
                dVar14 = local_20->q;
                dVar12 = *in_RSI;
                auVar15._0_8_ =
                     _ppd(in_stack_fffffffffffffe40,
                          (double)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          7.67567541672169e-318);
                auVar15._8_56_ = extraout_var;
                auVar19._8_8_ = 0;
                auVar19._0_8_ = -dVar12;
                auVar3 = vfmadd213sd_fma(auVar15._0_16_,auVar19,ZEXT816(0x3ff0000000000000));
                local_20->q = dVar14 / auVar3._0_8_;
                *pdVar8 = *pdVar8 - local_20->q;
              }
            }
          }
        }
      }
      for (local_b4 = 0; local_b4 < in_RDI->n_ion_populations + 3; local_b4 = local_b4 + 1) {
        if ((pdVar8[local_b4] != 0.0) || (NAN(pdVar8[local_b4]))) {
          pdVar9[local_b4] = pdVar9[local_b4] / pdVar8[local_b4];
        }
        else {
          pdVar9[local_b4] = 0.0;
        }
      }
      for (local_b8 = 0; local_b8 < in_RDI->nx; local_b8 = local_b8 + 1) {
        for (local_bc = 0; local_bc < in_RDI->ny; local_bc = local_bc + 1) {
          for (local_c0 = 0; local_c0 < in_RDI->nz; local_c0 = local_c0 + 1) {
            pppcVar10 = field3d<cellp>::operator[]
                                  ((field3d<cellp> *)in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
            for (local_20 = (*pppcVar10)[local_bc][local_c0].pl.head; local_20 != (particle *)0x0;
                local_20 = local_20->next) {
              if ((local_20->cmr != -1.0) || (NAN(local_20->cmr))) {
                if ((local_20->cmr != 1.0) || (NAN(local_20->cmr))) {
                  if ((local_20->cmr != 0.0) || (NAN(local_20->cmr))) {
                    for (local_c4 = 0; local_c4 < in_RDI->n_ion_populations; local_c4 = local_c4 + 1
                        ) {
                      if ((local_20->cmr == in_RDI->icmr[local_c4]) &&
                         (!NAN(local_20->cmr) && !NAN(in_RDI->icmr[local_c4]))) {
                        local_20->q = pdVar9[local_c4 + 3] * local_20->q;
                      }
                    }
                  }
                  else {
                    local_20->q = pdVar9[2] * local_20->q;
                  }
                }
                else {
                  local_20->q = pdVar9[1] * local_20->q;
                }
              }
              else {
                local_20->q = *pdVar9 * local_20->q;
              }
            }
          }
        }
      }
      if (pdVar11 != (double *)0x0) {
        operator_delete__(pdVar11);
      }
    }
  }
  if (pdVar8 != (double *)0x0) {
    operator_delete__(pdVar8);
  }
  if (pdVar9 != (double *)0x0) {
    operator_delete__(pdVar9);
  }
  return;
}

Assistant:

void spatial_region::pmerging(double* ppd, string pmerging)
{
    /* Из-за флуктуаций отношение удаляемого заряда к полному не равно
     * ppd, поэтому для сохранения нейтральности приходится считать
     * это отношение для каждого сорта частиц отдельно и использовать
     * именно его при при увеличении заряда */
    particle* current;
    particle* tmp;
    double* qs = new double[3+n_ion_populations];
    double* a = new double[3+n_ion_populations];
    for (int i=0;i<3+n_ion_populations;i++) {
        qs[i] = 0;
        a[i] = 0;
    }
    for(int i=0;i<nx;i++) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                current = cp[i][j][k].pl.head;
                while(current!=0) {
                    if (current->cmr==-1)
                        a[0] -= current->q;
                    else if (current->cmr==1)
                        a[1] += current->q;
                    else if (current->cmr==0)
                        a[2] += current->q;
                    else {
                        for (int ii=0;ii<n_ion_populations;ii++) {
                            if (current->cmr==icmr[ii])
                                a[3+ii] += current->q;
                        }
                    }
                    current = current->next;
                }
            }
        }
    }
    if (pmerging=="ti") {
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (get_rand()<ppd[0]) {
                            tmp = current->next;
                            if (current->cmr==-1)
                                qs[0] -= current->q;
                            else if (current->cmr==1)
                                qs[1] += current->q;
                            else if (current->cmr==0)
                                qs[2] += current->q;
                            else {
                                for (int ii=0;ii<n_ion_populations;ii++) {
                                    if (current->cmr==icmr[ii])
                                        qs[3+ii] += current->q;
                                }
                            }
                            //
                            if (current->next!=0)
                                (current->next)->previous = current->previous;
                            //
                            if (current->previous!=0)
                                (current->previous)->next = current->next;
                            else {
                                cp[i][j][k].pl.head = current->next;
                                cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                            }
                            delete_particle(current);
                            //
                            current = tmp;
                        }
                        else
                            current = current->next;
                    }
                }
            }
        }
        //
        if (a[0]-qs[0]!=0)
            a[0] = a[0]/(a[0]-qs[0]);
        if (a[1]-qs[1]!=0)
            a[1] = a[1]/(a[1]-qs[1]);
        if (a[2]-qs[2]!=0)
            a[2] = a[2]/(a[2]-qs[2]);
        for (int i=0;i<n_ion_populations;i++) {
            if (a[3+i]-qs[3+i]!=0)
                a[3+i] = a[3+i]/(a[3+i]-qs[3+i]);
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
    } else if (pmerging=="nl") {
        double* av_q = new double[3+n_ion_populations];
        for(int i=0;i<3+n_ion_populations;i++)
            av_q[i] = 0;
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            av_q[0] += 1;
                        else if (current->cmr==1)
                            av_q[1] += 1;
                        else if (current->cmr==0)
                            av_q[2] += 1;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    av_q[3+ii] += 1;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for (int i=0;i<3+n_ion_populations;i++)
            av_q[i] = a[i]/av_q[i];
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        tmp = current->next;
                        if (current->cmr==-1) {
                            if (get_rand()<ppd[0]*_ppd(-current->q,av_q[0])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==1) {
                            if (get_rand()<ppd[1]*_ppd(current->q,av_q[1])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==0) {
                            if (get_rand()<ppd[2]*_ppd(current->q,av_q[2])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    if (get_rand()<ppd[3+ii]*_ppd(current->q,av_q[3+ii])) {
                                        if (current->next!=0)
                                            (current->next)->previous = current->previous;
                                        if (current->previous!=0)
                                            (current->previous)->next = current->next;
                                        else {
                                            cp[i][j][k].pl.head = current->next;
                                            cp[i][j][k].pl.start = current->next;
                                        }
                                        delete_particle(current);
                                    } 
                                }
                            }
                        }
                        current = tmp;
                    }
                }
            }
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1) {
                            current->q = current->q/(1-ppd[0]*_ppd(-current->q,av_q[0]));
                            qs[0] -= current->q;
                        } else if (current->cmr==1) {
                            current->q = current->q/(1-ppd[1]*_ppd(current->q,av_q[1]));
                            qs[1] += current->q;
                        } else if (current->cmr==0) {
                            current->q = current->q/(1-ppd[2]*_ppd(current->q,av_q[2]));
                            qs[2] += current->q;
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    current->q = current->q/(1-ppd[3+ii]*_ppd(current->q,av_q[3+ii]));
                                    qs[3+ii] += current->q;
                                }
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for(int i=0;i<3+n_ion_populations;i++) {
            if (qs[i]!=0)
                a[i] = a[i]/qs[i];
            else
                a[i] = 0;
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        delete[] av_q;
    }
    delete[] qs;
    delete[] a;
}